

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_detail.c
# Opt level: O2

int main(void)

{
  uint insn;
  undefined *puVar1;
  uchar *buffer;
  uint64_t uVar2;
  cs_detail *pcVar3;
  cs_insn *pcVar4;
  size_t count;
  cs_err cVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  csh handle;
  long local_48;
  size_t local_40;
  cs_insn *all_insn;
  
  lVar10 = 0;
  while (lVar10 != 0x14) {
    puts("****************");
    puVar1 = (&PTR_anon_var_dwarf_45_002672a8)[lVar10 * 5];
    local_48 = lVar10;
    printf("Platform: %s\n",puVar1);
    cVar5 = cs_open((&DAT_00267290)[lVar10 * 10],(&DAT_00267294)[lVar10 * 10],&handle);
    if (cVar5 == CS_ERR_OK) {
      if ((&DAT_002672b0)[lVar10 * 10] != 0) {
        cs_option(handle,(&DAT_002672b0)[lVar10 * 10],(ulong)(uint)(&DAT_002672b4)[lVar10 * 10]);
      }
      cs_option(handle,CS_OPT_DETAIL,3);
      buffer = (&PTR_anon_var_dwarf_27_00267298)[lVar10 * 5];
      sVar8 = (&DAT_002672a0)[lVar10 * 5];
      local_40 = cs_disasm(handle,buffer,sVar8,0x1000,0,&all_insn);
      if (local_40 == 0) {
        puts("****************");
        printf("Platform: %s\n",puVar1);
        print_string_hex(buffer,sVar8);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        print_string_hex(buffer,sVar8);
        puts("Disasm:");
        for (sVar8 = 0; count = local_40, sVar8 != local_40; sVar8 = sVar8 + 1) {
          pcVar4 = all_insn + sVar8;
          uVar2 = all_insn[sVar8].address;
          pcVar7 = all_insn[sVar8].op_str;
          insn = ((cs_insn *)(pcVar7 + -0x42))->id;
          pcVar6 = cs_insn_name(handle,insn);
          printf("0x%lx:\t%s\t\t%s // insn-ID: %u, insn-mnem: %s\n",uVar2,pcVar4->mnemonic,pcVar7,
                 (ulong)insn,pcVar6);
          pcVar3 = *(cs_detail **)(pcVar7 + 0xa6);
          if (pcVar3->regs_read_count != '\0') {
            printf("\tImplicit registers read: ");
            for (uVar9 = 0; uVar9 < pcVar3->regs_read_count; uVar9 = uVar9 + 1) {
              pcVar7 = cs_reg_name(handle,(uint)pcVar3->regs_read[uVar9]);
              printf("%s ",pcVar7);
            }
            putchar(10);
          }
          if (pcVar3->regs_write_count != '\0') {
            printf("\tImplicit registers modified: ");
            for (uVar9 = 0; uVar9 < pcVar3->regs_write_count; uVar9 = uVar9 + 1) {
              pcVar7 = cs_reg_name(handle,(uint)pcVar3->regs_write[uVar9]);
              printf("%s ",pcVar7);
            }
            putchar(10);
          }
          if (pcVar3->groups_count != '\0') {
            printf("\tThis instruction belongs to groups: ");
            for (uVar9 = 0; uVar9 < pcVar3->groups_count; uVar9 = uVar9 + 1) {
              pcVar7 = cs_group_name(handle,(uint)pcVar3->groups[uVar9]);
              printf("%s ",pcVar7);
            }
            putchar(10);
          }
        }
        printf("0x%lx:\n",(ulong)all_insn[local_40 - 1].size + all_insn[local_40 - 1].address);
        cs_free(all_insn,count);
      }
      putchar(10);
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar5);
    }
    lVar10 = local_48 + 1;
  }
  return 0;
}

Assistant:

int main()
{
	test();

	return 0;
}